

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::Common::DynamicBinaryData::readFrom
          (DynamicBinaryData *this,uint8 *buffer,uint32 bufLength)

{
  uint8 *__ptr;
  ushort uVar1;
  uint8 *__dest;
  
  if (bufLength < 2) {
    return 0xfffffffe;
  }
  uVar1 = *(ushort *)buffer;
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar1 = uVar1 << 8 | uVar1 >> 8;
    }
    else {
      uVar1 = 0;
    }
  }
  this->length = uVar1;
  if (bufLength < uVar1 + 2) {
    return 0xfffffffe;
  }
  __ptr = this->data;
  if (uVar1 != 0 || __ptr != (uint8 *)0x0) {
    if ((uVar1 != 0) && (__dest = (uint8 *)realloc(__ptr,(ulong)uVar1), __dest != (uint8 *)0x0))
    goto LAB_00108216;
    free(__ptr);
  }
  __dest = (uint8 *)0x0;
LAB_00108216:
  this->data = __dest;
  uVar1 = this->length;
  memcpy(__dest,buffer + 2,(ulong)uVar1);
  return uVar1 + 2;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if (bufLength < 2) return NotEnoughData;
                    uint16 size = 0; memcpy(&size, buffer, 2); length = BigEndian(size);
                    if ((uint32)(length+2) > bufLength) return NotEnoughData;
                    data = (uint8*)Platform::safeRealloc(data, length);
                    memcpy(data, buffer+2, length);
                    return (uint32)length + 2;
                }